

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.h
# Opt level: O1

uint llvm::ComputeEditDistance<char>
               (ArrayRef<char> FromArray,ArrayRef<char> ToArray,bool AllowReplacements,
               uint MaxEditDistance)

{
  ulong uVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  uint unaff_R14D;
  uint uVar14;
  bool bVar15;
  uint local_168 [2];
  uint SmallBuffer [64];
  uint *local_40;
  
  uVar8 = FromArray.Length;
  uVar4 = ToArray.Length;
  SmallBuffer._248_8_ = ToArray.Data;
  uVar5 = uVar4 + 1;
  if (uVar5 < 0x41) {
    puVar2 = local_168;
    local_40 = (uint *)0x0;
  }
  else {
    puVar2 = (uint *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
    local_40 = puVar2;
  }
  if (uVar4 != 0) {
    uVar5 = 1;
    do {
      puVar2[uVar5] = (uint)uVar5;
      uVar5 = (ulong)((uint)uVar5 + 1);
    } while (uVar5 <= uVar4);
  }
  bVar15 = uVar8 == 0;
  uVar14 = unaff_R14D;
  if (!bVar15) {
    uVar5 = 1;
    do {
      uVar11 = (uint)uVar5;
      *puVar2 = uVar11;
      if (uVar4 != 0) {
        uVar1 = uVar5 - 1;
        uVar6 = uVar1 & 0xffffffff;
        uVar12 = uVar5 & 0xffffffff;
        uVar7 = uVar4;
        pcVar13 = (char *)SmallBuffer._248_8_;
        puVar3 = puVar2;
        do {
          puVar9 = puVar3 + 1;
          uVar10 = (uint)uVar6;
          uVar14 = *puVar9;
          uVar6 = (ulong)uVar14;
          if (AllowReplacements) {
            if (uVar8 <= uVar1) {
LAB_00dbacae:
              __assert_fail("Index < Length && \"Invalid index!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/ArrayRef.h"
                            ,0xf0,
                            "const T &llvm::ArrayRef<char>::operator[](size_t) const [T = char]");
            }
            uVar10 = uVar10 + (FromArray.Data[uVar1] != *pcVar13);
            if (uVar14 < *puVar3) {
              puVar3 = puVar9;
            }
            if (*puVar3 + 1 < uVar10) {
              uVar10 = *puVar3 + 1;
            }
          }
          else {
            if (uVar8 <= uVar1) goto LAB_00dbacae;
            if (FromArray.Data[uVar1] != *pcVar13) {
              if (uVar14 < *puVar3) {
                puVar3 = puVar9;
              }
              uVar10 = *puVar3 + 1;
            }
          }
          if (uVar10 < (uint)uVar12) {
            uVar12 = (ulong)uVar10;
          }
          uVar11 = (uint)uVar12;
          *puVar9 = uVar10;
          pcVar13 = pcVar13 + 1;
          uVar7 = uVar7 - 1;
          puVar3 = puVar9;
        } while (uVar7 != 0);
      }
      uVar14 = MaxEditDistance + 1;
      if (MaxEditDistance < uVar11 && MaxEditDistance != 0) break;
      uVar5 = uVar5 + 1;
      bVar15 = uVar8 < uVar5;
      uVar14 = unaff_R14D;
    } while (uVar5 <= uVar8);
  }
  if (bVar15) {
    uVar14 = puVar2[uVar4];
  }
  if (local_40 != (uint *)0x0) {
    operator_delete__(local_40);
  }
  return uVar14;
}

Assistant:

unsigned ComputeEditDistance(ArrayRef<T> FromArray, ArrayRef<T> ToArray,
                             bool AllowReplacements = true,
                             unsigned MaxEditDistance = 0) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in Row[x-1], the top entry is what's in Row[x] from the last
  // iteration, and the top-left entry is stored in Previous.
  typename ArrayRef<T>::size_type m = FromArray.size();
  typename ArrayRef<T>::size_type n = ToArray.size();

  const unsigned SmallBufferSize = 64;
  unsigned SmallBuffer[SmallBufferSize];
  std::unique_ptr<unsigned[]> Allocated;
  unsigned *Row = SmallBuffer;
  if (n + 1 > SmallBufferSize) {
    Row = new unsigned[n + 1];
    Allocated.reset(Row);
  }

  for (unsigned i = 1; i <= n; ++i)
    Row[i] = i;

  for (typename ArrayRef<T>::size_type y = 1; y <= m; ++y) {
    Row[0] = y;
    unsigned BestThisRow = Row[0];

    unsigned Previous = y - 1;
    for (typename ArrayRef<T>::size_type x = 1; x <= n; ++x) {
      int OldRow = Row[x];
      if (AllowReplacements) {
        Row[x] = std::min(
            Previous + (FromArray[y-1] == ToArray[x-1] ? 0u : 1u),
            std::min(Row[x-1], Row[x])+1);
      }
      else {
        if (FromArray[y-1] == ToArray[x-1]) Row[x] = Previous;
        else Row[x] = std::min(Row[x-1], Row[x]) + 1;
      }
      Previous = OldRow;
      BestThisRow = std::min(BestThisRow, Row[x]);
    }

    if (MaxEditDistance && BestThisRow > MaxEditDistance)
      return MaxEditDistance + 1;
  }

  unsigned Result = Row[n];
  return Result;
}